

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

CodeGeneratorRequest *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::compiler::CodeGeneratorRequest>
          (Arena *arena)

{
  CodeGeneratorRequest *this;
  
  if (arena == (Arena *)0x0) {
    this = (CodeGeneratorRequest *)operator_new(0x58);
    compiler::CodeGeneratorRequest::CodeGeneratorRequest(this);
  }
  else {
    if (*(long *)(arena + 0x70) != 0) {
      OnArenaAllocation(arena,(type_info *)&compiler::CodeGeneratorRequest::typeinfo,0x58);
    }
    this = (CodeGeneratorRequest *)
           internal::ArenaImpl::AllocateAlignedAndAddCleanup
                     ((ArenaImpl *)arena,0x58,
                      internal::
                      arena_destruct_object<google::protobuf::compiler::CodeGeneratorRequest>);
    compiler::CodeGeneratorRequest::CodeGeneratorRequest(this);
  }
  return this;
}

Assistant:

void CodeGeneratorRequest::InitAsDefaultInstance() {
  PROTOBUF_NAMESPACE_ID::compiler::_CodeGeneratorRequest_default_instance_._instance.get_mutable()->compiler_version_ = const_cast< PROTOBUF_NAMESPACE_ID::compiler::Version*>(
      PROTOBUF_NAMESPACE_ID::compiler::Version::internal_default_instance());
}